

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanCommandBuffer::FlushBarriers(VulkanCommandBuffer *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char (*in_RCX) [32];
  uint uVar6;
  VkImageMemoryBarrier *pVVar7;
  pointer pVVar8;
  uint uVar9;
  undefined8 local_68;
  void *pvStack_60;
  uint local_58;
  uint local_54;
  string msg;
  
  if (((this->m_Barrier).MemoryDstStages != 0 || (this->m_Barrier).MemorySrcStages != 0) ||
     ((this->m_ImageBarriers).
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_ImageBarriers).
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    EndRenderScope(this);
    if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      Diligent::FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"FlushBarriers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
                 ,0xf7);
      std::__cxx11::string::~string((string *)&msg);
    }
    pvStack_60 = (void *)0x0;
    local_68._0_4_ = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
    local_68._4_4_ = 0;
    uVar1 = (this->m_Barrier).MemorySrcAccess;
    local_54 = (this->m_Barrier).SupportedAccessMask;
    local_58 = local_54 & uVar1;
    uVar2 = (this->m_Barrier).MemoryDstAccess;
    local_54 = local_54 & uVar2;
    uVar3 = (this->m_Barrier).MemorySrcStages;
    uVar4 = (this->m_Barrier).MemoryDstStages;
    uVar6 = (this->m_Barrier).SupportedStagesMask;
    uVar9 = ((this->m_Barrier).ImageDstStages | uVar4) & uVar6;
    uVar6 = (uVar3 | (this->m_Barrier).ImageSrcStages) & uVar6;
    if (uVar6 == 0 || uVar9 == 0) {
      Diligent::FormatString<char[26],char[33]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SrcStages != 0 && DstStages != 0",
                 (char (*) [33])(ulong)CONCAT31((int3)(uVar4 >> 8),uVar9 != 0));
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"FlushBarriers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
                 ,0x105);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVVar7 = (VkImageMemoryBarrier *)&local_68;
    if ((uVar1 == 0 || uVar2 == 0) || (uVar3 == 0 || uVar4 == 0)) {
      pVVar7 = (VkImageMemoryBarrier *)0x0;
    }
    pVVar8 = (this->m_ImageBarriers).
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar5 = (long)(this->m_ImageBarriers).
                  super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pVVar8;
    if (lVar5 == 0) {
      pVVar8 = (VkImageMemoryBarrier *)0x0;
    }
    (*vkCmdPipelineBarrier)
              (this->m_VkCmdBuffer,uVar6,uVar9,0,
               SUB14((uVar1 != 0 && uVar2 != 0) && (uVar3 != 0 && uVar4 != 0),0),
               (VkMemoryBarrier *)pVVar7,0,(VkBufferMemoryBarrier *)0x0,(uint32_t)(lVar5 / 0x48),
               pVVar8);
    pVVar8 = (this->m_ImageBarriers).
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->m_ImageBarriers).
        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar8) {
      (this->m_ImageBarriers).
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar8;
    }
    (this->m_Barrier).MemorySrcStages = 0;
    (this->m_Barrier).MemoryDstStages = 0;
    (this->m_Barrier).MemorySrcAccess = 0;
    (this->m_Barrier).MemoryDstAccess = 0;
    (this->m_Barrier).ImageSrcStages = 0;
    (this->m_Barrier).ImageDstStages = 0;
  }
  return;
}

Assistant:

void VulkanCommandBuffer::FlushBarriers()
{
    if (m_Barrier.MemorySrcStages == 0 && m_Barrier.MemoryDstStages == 0 && m_ImageBarriers.empty())
        return;

    EndRenderScope();

    VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);

    VkMemoryBarrier vkMemBarrier{};
    vkMemBarrier.sType         = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
    vkMemBarrier.pNext         = nullptr;
    vkMemBarrier.srcAccessMask = m_Barrier.MemorySrcAccess & m_Barrier.SupportedAccessMask;
    vkMemBarrier.dstAccessMask = m_Barrier.MemoryDstAccess & m_Barrier.SupportedAccessMask;

    const bool HasMemoryBarrier =
        m_Barrier.MemorySrcStages != 0 && m_Barrier.MemoryDstStages != 0 &&
        m_Barrier.MemorySrcAccess != 0 && m_Barrier.MemoryDstAccess != 0;

    const VkPipelineStageFlags SrcStages = (m_Barrier.ImageSrcStages | m_Barrier.MemorySrcStages) & m_Barrier.SupportedStagesMask;
    const VkPipelineStageFlags DstStages = (m_Barrier.ImageDstStages | m_Barrier.MemoryDstStages) & m_Barrier.SupportedStagesMask;
    VERIFY_EXPR(SrcStages != 0 && DstStages != 0);

    vkCmdPipelineBarrier(m_VkCmdBuffer,
                         SrcStages,
                         DstStages,
                         0,
                         HasMemoryBarrier ? 1 : 0,
                         HasMemoryBarrier ? &vkMemBarrier : nullptr,
                         0,
                         nullptr,
                         static_cast<uint32_t>(m_ImageBarriers.size()),
                         m_ImageBarriers.empty() ? nullptr : m_ImageBarriers.data());

    m_ImageBarriers.clear();
    m_Barrier.ImageSrcStages  = 0;
    m_Barrier.ImageDstStages  = 0;
    m_Barrier.MemorySrcStages = 0;
    m_Barrier.MemoryDstStages = 0;
    m_Barrier.MemorySrcAccess = 0;
    m_Barrier.MemoryDstAccess = 0;
    // Do not clear SupportedStagesMask and SupportedAccessMask
}